

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var Js::TypedArrayBase::EntryJoin(RecyclableObject *function,CallInfo callInfo,...)

{
  uint uVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *library;
  code *pcVar3;
  CharCount initialPointerCapacity;
  bool bVar4;
  BOOL BVar5;
  charcount_t cVar6;
  int iVar7;
  undefined4 *puVar8;
  TypedArrayBase *pTVar9;
  Var pvVar10;
  JavascriptString *this;
  CompoundString *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JavascriptString *pJVar11;
  undefined4 extraout_var_01;
  uint uVar12;
  ulong uVar13;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x7a6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d6d0e6;
    *puVar8 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_58,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x7a9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00d6d0e6:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  pTVar9 = ValidateTypedArray((Arguments *)local_58,pSVar2,L"[TypedArray].prototype.join");
  uVar1 = (pTVar9->super_ArrayBufferParent).super_ArrayObject.length;
  library = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)local_58 & 0xfffffe) != 0) {
    pvVar10 = Arguments::operator[]((Arguments *)local_58,1);
    BVar5 = JavascriptOperators::IsUndefined(pvVar10);
    if (BVar5 == 0) {
      pvVar10 = Arguments::operator[]((Arguments *)local_58,1);
      this = JavascriptConversion::ToString(pvVar10,pSVar2);
      goto LAB_00d6d001;
    }
  }
  this = StringCache::GetCommaDisplay(&library->stringCache);
LAB_00d6d001:
  if (uVar1 == 1) {
    iVar7 = (*(pTVar9->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pTVar9,0);
    this_00 = (CompoundString *)
              JavascriptConversion::ToString((Var)CONCAT44(extraout_var,iVar7),pSVar2);
  }
  else if (uVar1 == 0) {
    this_00 = (CompoundString *)JavascriptLibrary::GetEmptyString(library);
  }
  else {
    cVar6 = JavascriptString::GetLength(this);
    iVar7 = uVar1 - 1;
    if (cVar6 == 0) {
      iVar7 = 0;
    }
    initialPointerCapacity = iVar7 + uVar1;
    if (0x7fffff < iVar7 + uVar1) {
      initialPointerCapacity = 0x800000;
    }
    this_00 = CompoundString::NewWithPointerCapacity(initialPointerCapacity,library);
    iVar7 = (*(pTVar9->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pTVar9,0);
    pJVar11 = JavascriptConversion::ToString((Var)CONCAT44(extraout_var_00,iVar7),pSVar2);
    CompoundString::Append(this_00,pJVar11);
    if (1 < uVar1) {
      uVar13 = 1;
      do {
        if (cVar6 != 0) {
          CompoundString::Append(this_00,this);
        }
        iVar7 = (*(pTVar9->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(pTVar9,uVar13);
        pJVar11 = JavascriptConversion::ToString((Var)CONCAT44(extraout_var_01,iVar7),pSVar2);
        CompoundString::Append(this_00,pJVar11);
        uVar12 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar12;
      } while (uVar1 != uVar12);
    }
  }
  return this_00;
}

Assistant:

Var TypedArrayBase::EntryJoin(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_join);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.join"));
        uint32 length = typedArrayBase->GetLength();

        JavascriptLibrary* library = scriptContext->GetLibrary();
        JavascriptString* separator = nullptr;

        if (args.Info.Count > 1 && !JavascriptOperators::IsUndefined(args[1]))
        {
            separator = JavascriptConversion::ToString(args[1], scriptContext);
        }
        else
        {
            separator = library->GetCommaDisplayString();
        }

        if (length == 0)
        {
            return library->GetEmptyString();
        }
        else if (length == 1)
        {
            return JavascriptConversion::ToString(typedArrayBase->DirectGetItem(0), scriptContext);
        }

        bool hasSeparator = (separator->GetLength() != 0);

        charcount_t estimatedAppendSize = min(
            static_cast<charcount_t>((64 << 20) / sizeof(void *)), // 64 MB worth of pointers
            static_cast<charcount_t>(length + (hasSeparator ? length - 1 : 0)));

        CompoundString* const cs = CompoundString::NewWithPointerCapacity(estimatedAppendSize, library);

        Assert(length >= 2);

        JavascriptString* element = JavascriptConversion::ToString(typedArrayBase->DirectGetItem(0), scriptContext);

        cs->Append(element);

        for (uint32 i = 1; i < length; i++)
        {
            if (hasSeparator)
            {
                cs->Append(separator);
            }

            // Since i < length, we can be certain that the TypedArray contains an item at index i and we don't have to check for undefined
            element = JavascriptConversion::ToString(typedArrayBase->DirectGetItem(i), scriptContext);

            cs->Append(element);
        }

        return cs;
    }